

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall
amrex::MLEBABecLap::restriction
          (MLEBABecLap *this,int amrlev,int cmglev,MultiFab *crse,MultiFab *fine)

{
  pointer pIVar1;
  int ncomp;
  IntVect ratio;
  IntVect local_20;
  
  if (amrlev < 1) {
    pIVar1 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.mg_coarsen_ratio_vec.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_20.vect[2] = pIVar1[(long)cmglev + -1].vect[2];
    local_20.vect._0_8_ = *(undefined8 *)pIVar1[(long)cmglev + -1].vect;
  }
  else {
    local_20.vect[0] = 2;
    local_20.vect[1] = 2;
    local_20.vect[2] = 2;
  }
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  EB_average_down(fine,crse,0,ncomp,&local_20);
  return;
}

Assistant:

void
MLEBABecLap::restriction (int amrlev, int cmglev, MultiFab& crse, MultiFab& fine) const
{
    IntVect ratio = (amrlev > 0) ? IntVect(mg_coarsen_ratio) : mg_coarsen_ratio_vec[cmglev-1];
    const int ncomp = getNComp();
    amrex::EB_average_down(fine, crse, 0, ncomp, ratio);
}